

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O1

bool __thiscall
ctemplate::TemplateCache::ExpandLocked
          (TemplateCache *this,TemplateString *filename,Strip strip,ExpandEmitter *expand_emitter,
          TemplateDictionaryInterface *dict,PerExpandData *per_expand_data)

{
  bool bVar1;
  int iVar2;
  RefcountedTemplate *this_00;
  WriterMutexLock ml;
  TemplateCacheKey template_cache_key;
  WriterMutexLock local_48;
  TemplateCacheKey local_40;
  
  local_40.first = TemplateString::GetGlobalId(filename);
  local_48.mu_ = this->mutex_;
  local_40.second = strip;
  if (((pthread_rwlock_t *)((long)local_48.mu_ + 0x38))->__size[0] == '\x01') {
    iVar2 = pthread_rwlock_wrlock((pthread_rwlock_t *)local_48.mu_);
    if (iVar2 != 0) goto LAB_00121ac6;
  }
  this_00 = GetTemplateLocked(this,filename,strip,&local_40);
  if (this_00 == (RefcountedTemplate *)0x0) {
    WriterMutexLock::~WriterMutexLock(&local_48);
    bVar1 = false;
  }
  else {
    RefcountedTemplate::IncRef(this_00);
    WriterMutexLock::~WriterMutexLock(&local_48);
    bVar1 = Template::ExpandLocked(this_00->ptr_,expand_emitter,dict,per_expand_data,this);
    local_48.mu_ = this->mutex_;
    if (((pthread_rwlock_t *)((long)local_48.mu_ + 0x38))->__size[0] == '\x01') {
      iVar2 = pthread_rwlock_wrlock((pthread_rwlock_t *)local_48.mu_);
      if (iVar2 != 0) {
LAB_00121ac6:
        abort();
      }
    }
    RefcountedTemplate::DecRefN(this_00,1);
    WriterMutexLock::~WriterMutexLock(&local_48);
  }
  return bVar1;
}

Assistant:

bool TemplateCache::ExpandLocked(const TemplateString& filename,
                                 Strip strip,
                                 ExpandEmitter *expand_emitter,
                                 const TemplateDictionaryInterface *dict,
                                 PerExpandData *per_expand_data) {
  TemplateCacheKey template_cache_key(filename.GetGlobalId(), strip);
  RefcountedTemplate* refcounted_tpl = NULL;
  {
    WriterMutexLock ml(mutex_);
    refcounted_tpl = GetTemplateLocked(filename, strip, template_cache_key);
    if (!refcounted_tpl)
      return false;
    refcounted_tpl->IncRef();
  }
  const bool result = refcounted_tpl->tpl()->ExpandLocked(
      expand_emitter, dict, per_expand_data, this);
  {
    WriterMutexLock ml(mutex_);
    refcounted_tpl->DecRef();
  }
  return result;
}